

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O2

void prvTidyDeclareUserTag(TidyDocImpl *doc,TidyOptionImpl *opt,ctmbstr name)

{
  TidyOptionId TVar1;
  ulong uVar2;
  UserTagType UStack_8;
  
  TVar1 = opt->id;
  if (TVar1 == TidyPreTags) {
    UStack_8 = tagtype_pre;
  }
  else {
    if (TVar1 == TidyCustomTags) {
      uVar2 = (doc->config).value[0x56].v;
      if (uVar2 - 1 < 4) {
        prvTidyDefineTag(doc,*(UserTagType *)("wbr" + uVar2 * 4),name);
        return;
      }
LAB_0013ee20:
      prvTidyReportUnknownOption(doc,opt->name);
      return;
    }
    if (TVar1 == TidyEmptyTags) {
      UStack_8 = tagtype_empty;
    }
    else if (TVar1 == TidyInlineTags) {
      UStack_8 = tagtype_inline;
    }
    else {
      if (TVar1 != TidyBlockTags) goto LAB_0013ee20;
      UStack_8 = tagtype_block;
    }
  }
  prvTidyDefineTag(doc,UStack_8,name);
  return;
}

Assistant:

void TY_(DeclareUserTag)( TidyDocImpl* doc, const TidyOptionImpl* opt, ctmbstr name )
{
    UserTagType tagType;

    switch ( opt->id )
    {
        case TidyInlineTags:  tagType = tagtype_inline;              break;
        case TidyBlockTags:   tagType = tagtype_block;               break;
        case TidyEmptyTags:   tagType = tagtype_empty;               break;
        case TidyPreTags:     tagType = tagtype_pre;                 break;
        case TidyCustomTags:
        {
            switch (cfg( doc, TidyUseCustomTags ))
            {
                case TidyCustomBlocklevel: tagType = tagtype_block;  break;
                case TidyCustomEmpty:      tagType = tagtype_empty;  break;
                case TidyCustomInline:     tagType = tagtype_inline; break;
                case TidyCustomPre:        tagType = tagtype_pre;    break;
                default: TY_(ReportUnknownOption)( doc, opt->name ); return;
            }
        } break;
        default:
        TY_(ReportUnknownOption)( doc, opt->name );
        return;
    }

    TY_(DefineTag)( doc, tagType, name );
}